

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_insertAString_failure_bufferExpansionFailed_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined8 uStack_90;
  AString srcString;
  AString destString;
  
  destString.reallocator._0_4_ = 0x11e238;
  destString.reallocator._4_4_ = 0;
  destString.deallocator._0_4_ = 0x11e278;
  destString.deallocator._4_4_ = 0;
  destString.buffer = (char *)0x0;
  destString.size = 5;
  destString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x129eed;
  destString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(destString.buffer,"01678",6);
  srcString.buffer = (char *)0x0;
  srcString.reallocator._0_4_ = 0x11e238;
  srcString.reallocator._4_4_ = 0;
  srcString.deallocator._0_4_ = 0x11e278;
  srcString.deallocator._4_4_ = 0;
  srcString.size = 4;
  srcString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x129f4d;
  srcString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(srcString.buffer,"2345",5);
  private_ACUtilsTest_AString_reallocFailCounter = 0;
  private_ACUtilsTest_AString_reallocFail = 1;
  uStack_90 = 0x129f8e;
  bVar1 = AString_insertAString(&destString,2,&srcString);
  if (bVar1 != false) {
    uStack_90 = 0x12a127;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x381,
                      "Assertion \'!AString_insertAString(&destString, 2, &srcString)\' failed",0,0)
    ;
  }
  uStack_90 = 0x129fa7;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x381);
  if (destString.capacity != 8) {
    pcVar8 = "(destString).capacity == (8)";
    pcVar4 = "(destString).capacity";
    iVar2 = 0x382;
    pcVar5 = (char *)destString.capacity;
LAB_0012a255:
    local_a0 = "(8)";
    local_98 = (char *)0x8;
LAB_0012a332:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_a0;
    goto LAB_0012a334;
  }
  uStack_90 = 0x129fc7;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x382);
  if (destString.buffer == (char *)0x0) {
    ppcVar7 = &local_98;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (destString).buffer != NULL";
    pcVar9 = "(void*) (destString).buffer";
    iVar2 = 0x382;
    goto LAB_0012a37f;
  }
  uStack_90 = 0x129fe4;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x382);
  pcVar9 = destString.buffer;
  if (destString.buffer == (char *)0x0) {
    pcVar5 = "";
    pcVar9 = "(null)";
LAB_0012a1aa:
    local_a0 = "01678";
    pcStack_b0 = "(\"01678\")";
    pcVar8 = "(destString).buffer == (\"01678\")";
    pcVar4 = "(void*) (destString).buffer";
    iVar2 = 0x382;
  }
  else {
    uStack_90 = 0x12a001;
    iVar2 = strcmp("01678",destString.buffer);
    if (iVar2 != 0) {
      pcVar5 = "\"";
      goto LAB_0012a1aa;
    }
    uStack_90 = 0x12a01a;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x382);
    if (destString.size != 5) {
      local_a0 = "strlen(\"01678\")";
      pcVar8 = "(destString).size == strlen(\"01678\")";
      pcVar4 = "(destString).size";
      iVar2 = 0x382;
      local_98 = (char *)0x5;
      pcVar5 = (char *)destString.size;
      goto LAB_0012a332;
    }
    uStack_90 = 0x12a03a;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x382);
    if (srcString.capacity != 8) {
      pcVar8 = "(srcString).capacity == (8)";
      pcVar4 = "(srcString).capacity";
      iVar2 = 899;
      pcVar5 = (char *)srcString.capacity;
      goto LAB_0012a255;
    }
    uStack_90 = 0x12a05a;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,899);
    if (srcString.buffer == (char *)0x0) {
      ppcVar7 = &local_98;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (srcString).buffer != NULL";
      pcVar9 = "(void*) (srcString).buffer";
      iVar2 = 899;
LAB_0012a37f:
      uStack_90 = 0;
      local_98 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) = test_AString_insertAString_failure_nullptrDestArray_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_90 = 0x12a077;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,899);
    pcVar9 = srcString.buffer;
    if (srcString.buffer == (char *)0x0) {
      pcVar9 = "(null)";
      pcVar5 = "";
    }
    else {
      uStack_90 = 0x12a094;
      iVar2 = strcmp("2345",srcString.buffer);
      if (iVar2 == 0) {
        uStack_90 = 0x12a0ad;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,899);
        if (srcString.size == 4) {
          uStack_90 = 0x12a0cd;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,899);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_90 = 0x12a0ee;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,900);
            uStack_90 = 0x12a0f7;
            (*(code *)CONCAT44(destString.deallocator._4_4_,destString.deallocator._0_4_))
                      (destString.buffer);
            uStack_90 = 0x12a100;
            (*(code *)CONCAT44(srcString.deallocator._4_4_,srcString.deallocator._0_4_))
                      (srcString.buffer);
            return;
          }
          ppcVar7 = &local_a8;
          local_a0 = "(0)";
          local_a8 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 900;
          goto LAB_0012a37f;
        }
        local_a0 = "strlen(\"2345\")";
        pcVar8 = "(srcString).size == strlen(\"2345\")";
        pcVar4 = "(srcString).size";
        iVar2 = 899;
        local_98 = (char *)0x4;
        pcVar5 = (char *)srcString.size;
        goto LAB_0012a332;
      }
      pcVar5 = "\"";
    }
    local_a0 = "2345";
    pcStack_b0 = "(\"2345\")";
    pcVar8 = "(srcString).buffer == (\"2345\")";
    pcVar4 = "(void*) (srcString).buffer";
    iVar2 = 899;
  }
  pcVar4 = pcVar4 + 8;
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_98 = "\"";
  local_a8 = "\"";
  ppcVar6 = &pcStack_c0;
  pcStack_c0 = pcVar9;
  pcStack_b8 = pcVar5;
LAB_0012a334:
  uStack_90 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar5;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x12a33b;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar8,pcVar4);
}

Assistant:

END_TEST
START_TEST(test_AString_insertAString_failure_bufferExpansionFailed)
{
    struct AString destString = private_ACUtilsTest_AString_constructTestString("01678", 8);
    struct AString srcString = private_ACUtilsTest_AString_constructTestString("2345", 8);
    private_ACUtilsTest_AString_setReallocFail(true, 0);
    ACUTILSTEST_ASSERT(!AString_insertAString(&destString, 2, &srcString));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(destString, "01678", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(srcString, "2345", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(destString);
    private_ACUtilsTest_AString_destructTestString(srcString);
}